

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathTrailing(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr node;
  
  if (((nodes2 != (xmlNodeSetPtr)0x0) && (nodes2->nodeNr != 0)) &&
     (nodes2->nodeTab != (xmlNodePtr *)0x0)) {
    if (((nodes1 != (xmlNodeSetPtr)0x0) && ((long)nodes1->nodeNr != 0)) &&
       (nodes1->nodeTab != (xmlNodePtr *)0x0)) {
      libxml_domnode_tim_sort(nodes1->nodeTab,(long)nodes1->nodeNr);
      libxml_domnode_tim_sort(nodes2->nodeTab,(long)nodes2->nodeNr);
      if (nodes2->nodeNr < 1) {
        node = (xmlNodePtr)0x0;
      }
      else {
        node = *nodes2->nodeTab;
      }
      pxVar1 = xmlXPathNodeTrailingSorted(nodes1,node);
      return pxVar1;
    }
    nodes1 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (nodes1 == (xmlNodeSetPtr)0x0) {
      nodes1 = (xmlNodeSetPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    }
    else {
      nodes1->nodeNr = 0;
      nodes1->nodeMax = 0;
      nodes1->nodeTab = (xmlNodePtr *)0x0;
    }
  }
  return nodes1;
}

Assistant:

xmlNodeSetPtr
xmlXPathTrailing (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(nodes1);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(xmlXPathNodeSetCreate(NULL));
    xmlXPathNodeSetSort(nodes1);
    xmlXPathNodeSetSort(nodes2);
    return(xmlXPathNodeTrailingSorted(nodes1,
				      xmlXPathNodeSetItem(nodes2, 0)));
}